

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# equalizer.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_13acd4::EqualizerState::update
          (EqualizerState *this,ALCcontext *context,EffectSlot *slot,EffectProps *props,
          EffectTarget target)

{
  anon_class_24_2_544d122c func;
  ALCdevice *pAVar1;
  index_type iVar2;
  long in_RCX;
  long in_RDX;
  RealMixParams *in_RSI;
  long in_RDI;
  long in_R8;
  float fVar3;
  undefined4 uVar4;
  float fVar5;
  double dVar6;
  anon_class_24_2_544d122c set_gains;
  size_t i;
  float f0norm;
  float gain;
  float frequency;
  ALCdevice *device;
  float in_stack_ffffffffffffff60;
  float in_stack_ffffffffffffff64;
  undefined8 in_stack_ffffffffffffff68;
  BiquadFilterR<float> *in_stack_ffffffffffffff70;
  ulong uVar7;
  ulong local_50;
  undefined4 in_stack_ffffffffffffffb8;
  
  pAVar1 = al::intrusive_ptr<ALCdevice>::get
                     ((intrusive_ptr<ALCdevice> *)(in_RSI[5].ChannelIndex._M_elems + 4));
  fVar3 = (float)pAVar1->Frequency;
  std::sqrt((double)(ulong)*(uint *)(in_RCX + 4));
  BiquadFilterR<float>::setParamsFromSlope
            (in_stack_ffffffffffffff70,(BiquadType)((ulong)in_stack_ffffffffffffff68 >> 0x20),
             (float)in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,in_stack_ffffffffffffff60);
  std::sqrt((double)(ulong)*(uint *)(in_RCX + 0xc));
  BiquadFilterR<float>::setParamsFromBandwidth
            (in_stack_ffffffffffffff70,(BiquadType)((ulong)in_stack_ffffffffffffff68 >> 0x20),
             (float)in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,in_stack_ffffffffffffff60);
  std::sqrt((double)(ulong)*(uint *)(in_RCX + 0x18));
  BiquadFilterR<float>::setParamsFromBandwidth
            (in_stack_ffffffffffffff70,(BiquadType)((ulong)in_stack_ffffffffffffff68 >> 0x20),
             (float)in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,in_stack_ffffffffffffff60);
  dVar6 = std::sqrt((double)(ulong)*(uint *)(in_RCX + 0x24));
  uVar4 = SUB84(dVar6,0);
  fVar5 = *(float *)(in_RCX + 0x20) / fVar3;
  BiquadFilterR<float>::setParamsFromSlope
            (in_stack_ffffffffffffff70,(BiquadType)((ulong)in_stack_ffffffffffffff68 >> 0x20),
             (float)in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,in_stack_ffffffffffffff60);
  local_50 = 1;
  while( true ) {
    uVar7 = local_50;
    iVar2 = al::span<std::array<float,_1024UL>,_18446744073709551615UL>::size
                      ((span<std::array<float,_1024UL>,_18446744073709551615UL> *)(in_RDX + 0x88));
    if (iVar2 <= uVar7) break;
    BiquadFilterR<float>::copyParamsFrom
              ((BiquadFilterR<float> *)(in_RDI + 0x20 + local_50 * 0xf0),
               (BiquadFilterR<float> *)(in_RDI + 0x20));
    BiquadFilterR<float>::copyParamsFrom
              ((BiquadFilterR<float> *)(in_RDI + local_50 * 0xf0 + 0x3c),
               (BiquadFilterR<float> *)(in_RDI + 0x3c));
    BiquadFilterR<float>::copyParamsFrom
              ((BiquadFilterR<float> *)(in_RDI + local_50 * 0xf0 + 0x58),
               (BiquadFilterR<float> *)(in_RDI + 0x58));
    BiquadFilterR<float>::copyParamsFrom
              ((BiquadFilterR<float> *)(in_RDI + local_50 * 0xf0 + 0x74),
               (BiquadFilterR<float> *)(in_RDI + 0x74));
    local_50 = local_50 + 1;
  }
  *(undefined8 *)(in_RDI + 0x10) = *(undefined8 *)(in_R8 + 0x80);
  *(undefined8 *)(in_RDI + 0x18) = *(undefined8 *)(in_R8 + 0x88);
  std::begin<(anonymous_namespace)::EqualizerState::__0,16ul>
            ((anon_struct_240_3_8d696fa7 (*) [16])(in_RDI + 0x20));
  al::span<std::array<float,_1024UL>,_18446744073709551615UL>::size
            ((span<std::array<float,_1024UL>,_18446744073709551615UL> *)(in_RDX + 0x88));
  func.target.Main = (MixParams *)in_RDX;
  func.slot = (EffectSlot *)in_RCX;
  func.target.RealOut = in_RSI;
  SetAmbiPanIdentity<(anonymous_namespace)::EqualizerState::__0*,unsigned_long,(anonymous_namespace)::EqualizerState::update(ALCcontext_const*,EffectSlot_const*,EffectProps_const*,EffectTarget)::__0>
            ((anon_struct_240_3_8d696fa7 *)CONCAT44(fVar3,uVar4),
             CONCAT44(fVar5,in_stack_ffffffffffffffb8),func);
  return;
}

Assistant:

void EqualizerState::update(const ALCcontext *context, const EffectSlot *slot,
    const EffectProps *props, const EffectTarget target)
{
    const ALCdevice *device{context->mDevice.get()};
    auto frequency = static_cast<float>(device->Frequency);
    float gain, f0norm;

    /* Calculate coefficients for the each type of filter. Note that the shelf
     * and peaking filters' gain is for the centerpoint of the transition band,
     * while the effect property gains are for the shelf/peak itself. So the
     * property gains need their dB halved (sqrt of linear gain) for the
     * shelf/peak to reach the provided gain.
     */
    gain = std::sqrt(props->Equalizer.LowGain);
    f0norm = props->Equalizer.LowCutoff / frequency;
    mChans[0].filter[0].setParamsFromSlope(BiquadType::LowShelf, f0norm, gain, 0.75f);

    gain = std::sqrt(props->Equalizer.Mid1Gain);
    f0norm = props->Equalizer.Mid1Center / frequency;
    mChans[0].filter[1].setParamsFromBandwidth(BiquadType::Peaking, f0norm, gain,
        props->Equalizer.Mid1Width);

    gain = std::sqrt(props->Equalizer.Mid2Gain);
    f0norm = props->Equalizer.Mid2Center / frequency;
    mChans[0].filter[2].setParamsFromBandwidth(BiquadType::Peaking, f0norm, gain,
        props->Equalizer.Mid2Width);

    gain = std::sqrt(props->Equalizer.HighGain);
    f0norm = props->Equalizer.HighCutoff / frequency;
    mChans[0].filter[3].setParamsFromSlope(BiquadType::HighShelf, f0norm, gain, 0.75f);

    /* Copy the filter coefficients for the other input channels. */
    for(size_t i{1u};i < slot->Wet.Buffer.size();++i)
    {
        mChans[i].filter[0].copyParamsFrom(mChans[0].filter[0]);
        mChans[i].filter[1].copyParamsFrom(mChans[0].filter[1]);
        mChans[i].filter[2].copyParamsFrom(mChans[0].filter[2]);
        mChans[i].filter[3].copyParamsFrom(mChans[0].filter[3]);
    }

    mOutTarget = target.Main->Buffer;
    auto set_gains = [slot,target](auto &chan, al::span<const float,MAX_AMBI_CHANNELS> coeffs)
    { ComputePanGains(target.Main, coeffs.data(), slot->Gain, chan.TargetGains); };
    SetAmbiPanIdentity(std::begin(mChans), slot->Wet.Buffer.size(), set_gains);
}